

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue
          (FileKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  bool bVar1;
  Type TVar2;
  size_t sVar3;
  pointer pIVar4;
  void *pvVar5;
  ostream *poVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  reference local_2e8;
  byte *b;
  const_iterator __end1;
  const_iterator __begin1;
  Bytes *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_240 [8];
  string keyHash;
  ofstream os;
  EncodedValue *value_local;
  HashedValue *key_local;
  FileKeyValueStore *this_local;
  
  std::ofstream::ofstream((void *)((long)&keyHash.field_2 + 8));
  sVar3 = groundupdb::HashedValue::hash(key);
  std::__cxx11::to_string((string *)local_240,sVar3);
  pIVar4 = std::
           unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 &pIVar4->m_fullpath,"/");
  std::operator+(&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+(&local_270,&local_290,".kv");
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((string *)(keyHash.field_2._M_local_buf + 8),(_Ios_Openmode)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&__range1);
  bVar1 = groundupdb::EncodedValue::hasValue(value);
  pvVar5 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),bVar1);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  TVar2 = groundupdb::EncodedValue::type(value);
  poVar6 = groundupdb::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),TVar2);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  sVar3 = groundupdb::EncodedValue::length(value);
  pvVar5 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),sVar3);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  groundupdb::EncodedValue::data((Bytes *)&__begin1,value);
  __end1 = std::vector<std::byte,_std::allocator<std::byte>_>::begin
                     ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  b = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                        ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                *)&b);
    if (!bVar1) break;
    local_2e8 = __gnu_cxx::
                __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                ::operator*(&__end1);
    std::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),*local_2e8);
    __gnu_cxx::
    __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator++(&__end1);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  std::ostream::operator<<
            ((void *)((long)&keyHash.field_2 + 8),std::endl<char,std::char_traits<char>>);
  sVar3 = groundupdb::EncodedValue::hash(value);
  pvVar5 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),sVar3);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  pIVar4 = std::
           unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::operator+(&local_348,&pIVar4->m_fullpath,"/");
  std::operator+(&local_328,&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+(&local_308,&local_328,".key");
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((string *)(keyHash.field_2._M_local_buf + 8),(_Ios_Openmode)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  TVar2 = groundupdb::EncodedValue::type(value);
  poVar6 = groundupdb::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),TVar2);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),pcVar7);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)local_240);
  std::ofstream::~ofstream((void *)((long)&keyHash.field_2 + 8));
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  os.open(mImpl->m_fullpath + "/" + keyHash + ".kv",
          std::ios::out | std::ios::trunc);
  os << value.hasValue() << std::endl;
  os << value.type() << std::endl;
  os << value.length() << std::endl;
  for (auto& b : value.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os << value.hash() << std::endl;
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << value.type() << std::endl;
  os << keyHash.c_str();
  os.close();
}